

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__writefv(stbi__write_context *s,char *fmt,__va_list_tag *v)

{
  uint uVar1;
  byte bVar2;
  undefined8 in_RAX;
  undefined1 *puVar3;
  undefined4 *puVar4;
  undefined2 *puVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  byte *pbVar9;
  uchar x;
  uchar b_1 [2];
  uchar b [4];
  undefined8 uStack_38;
  
  bVar2 = *fmt;
  if (bVar2 != 0) {
    pbVar9 = (byte *)(fmt + 1);
    uStack_38 = in_RAX;
    do {
      if (bVar2 < 0x32) {
        if (bVar2 != 0x20) {
          if (bVar2 != 0x31) {
LAB_00158b71:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image_write.h"
                          ,0x144,
                          "void stbiw__writefv(stbi__write_context *, const char *, __va_list_tag *)"
                         );
          }
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            puVar3 = (undefined1 *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            puVar3 = (undefined1 *)v->overflow_arg_area;
            v->overflow_arg_area = puVar3 + 8;
          }
          uStack_38._0_2_ = CONCAT11(*puVar3,(undefined1)uStack_38);
          pvVar8 = s->context;
          iVar6 = 1;
          pvVar7 = (void *)((long)&uStack_38 + 1);
          goto LAB_00158b51;
        }
      }
      else {
        if (bVar2 == 0x32) {
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            puVar5 = (undefined2 *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            puVar5 = (undefined2 *)v->overflow_arg_area;
            v->overflow_arg_area = puVar5 + 4;
          }
          uStack_38._0_4_ = CONCAT22(*puVar5,(undefined2)uStack_38);
          pvVar8 = s->context;
          iVar6 = 2;
          pvVar7 = (void *)((long)&uStack_38 + 2);
        }
        else {
          if (bVar2 != 0x34) goto LAB_00158b71;
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            puVar4 = (undefined4 *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            puVar4 = (undefined4 *)v->overflow_arg_area;
            v->overflow_arg_area = puVar4 + 2;
          }
          uStack_38 = CONCAT44(*puVar4,(undefined4)uStack_38);
          pvVar8 = s->context;
          iVar6 = 4;
          pvVar7 = (void *)((long)&uStack_38 + 4);
        }
LAB_00158b51:
        (*s->func)(pvVar8,pvVar7,iVar6);
      }
      bVar2 = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

static void stbiw__writefv(stbi__write_context *s, const char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { unsigned char x = STBIW_UCHAR(va_arg(v, int));
                     s->func(s->context,&x,1);
                     break; }
         case '2': { int x = va_arg(v,int);
                     unsigned char b[2];
                     b[0] = STBIW_UCHAR(x);
                     b[1] = STBIW_UCHAR(x>>8);
                     s->func(s->context,b,2);
                     break; }
         case '4': { stbiw_uint32 x = va_arg(v,int);
                     unsigned char b[4];
                     b[0]=STBIW_UCHAR(x);
                     b[1]=STBIW_UCHAR(x>>8);
                     b[2]=STBIW_UCHAR(x>>16);
                     b[3]=STBIW_UCHAR(x>>24);
                     s->func(s->context,b,4);
                     break; }
         default:
            STBIW_ASSERT(0);
            return;
      }
   }
}